

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O3

void __thiscall
wavingz::demod::demod_nrz::demod_nrz
          (demod_nrz *this,size_t sample_rate,
          function<void_(unsigned_char_*,_unsigned_char_*)> *packet_callback)

{
  double sample_rate_00;
  undefined1 auVar1 [16];
  undefined1 local_a0 [56];
  array<double,_7UL> local_68;
  _Head_base<0UL,_double,_false> local_30;
  
  *(undefined8 *)(this->fsk_demod).s1._M_value = 0;
  *(undefined8 *)((this->fsk_demod).s1._M_value + 8) = 0;
  auVar1._8_4_ = (int)(sample_rate >> 0x20);
  auVar1._0_8_ = sample_rate;
  auVar1._12_4_ = 0x45300000;
  sample_rate_00 =
       (auVar1._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sample_rate) - 4503599627370496.0);
  butter_lp<6>((tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> *)local_a0,
               sample_rate_00,150000.0);
  iir_filter<6>::iir_filter
            (&this->lp1,local_30._M_head_impl,&local_68,(array<double,_7UL> *)local_a0);
  butter_lp<6>((tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> *)local_a0,
               sample_rate_00,150000.0);
  iir_filter<6>::iir_filter
            (&this->lp2,local_30._M_head_impl,&local_68,(array<double,_7UL> *)local_a0);
  butter_lp<3>((tuple<double,_std::array<double,_4UL>,_std::array<double,_4UL>_> *)local_a0,
               sample_rate_00,50000.0);
  iir_filter<3>::iir_filter
            (&this->freq_filter,local_68._M_elems[1],(array<double,_4UL> *)(local_a0 + 0x20),
             (array<double,_4UL> *)local_a0);
  butter_lp<3>((tuple<double,_std::array<double,_4UL>,_std::array<double,_4UL>_> *)local_a0,
               sample_rate_00,750.0);
  iir_filter<3>::iir_filter
            (&this->lock_filter,local_68._M_elems[1],(array<double,_4UL> *)(local_a0 + 0x20),
             (array<double,_4UL> *)local_a0);
  state_machine::symbol_sm_t::symbol_sm_t(&this->symbols_sm,packet_callback);
  state_machine::sample_sm_t::sample_sm_t(&this->samples_sm,sample_rate,&this->symbols_sm);
  this->omega_c = 0.0;
  return;
}

Assistant:

demod_nrz(size_t sample_rate,
              std::function<void(uint8_t* begin, uint8_t* end)> packet_callback)
        : lp1(butter_lp<6>(sample_rate, 150000))
        , lp2(butter_lp<6>(sample_rate, 150000))
        , freq_filter(butter_lp<3>(sample_rate, 50000))
        , lock_filter(butter_lp<3>(sample_rate, 750))
        , symbols_sm(packet_callback)
        , samples_sm(sample_rate, symbols_sm)

    {
    }